

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdatastream.h
# Opt level: O2

QDataStream *
QtPrivate::writeAssociativeContainer<QMap<int,QVariant>>(QDataStream *s,QMap<int,_QVariant> *c)

{
  QMapData<std::map<int,_QVariant,_std::less<int>,_std::allocator<std::pair<const_int,_QVariant>_>_>_>
  *pQVar1;
  bool bVar2;
  QDataStream *s_00;
  _Base_ptr p_Var3;
  size_t value;
  _Rb_tree_node_base *p_Var4;
  
  pQVar1 = (c->d).d.ptr;
  if (pQVar1 == (QMapData<std::map<int,_QVariant,_std::less<int>,_std::allocator<std::pair<const_int,_QVariant>_>_>_>
                 *)0x0) {
    value = 0;
  }
  else {
    value = (pQVar1->m)._M_t._M_impl.super__Rb_tree_header._M_node_count;
  }
  bVar2 = QDataStream::writeQSizeType(s,value);
  if (bVar2) {
    pQVar1 = (c->d).d.ptr;
    if (pQVar1 == (QMapData<std::map<int,_QVariant,_std::less<int>,_std::allocator<std::pair<const_int,_QVariant>_>_>_>
                   *)0x0) {
      p_Var3 = (_Base_ptr)0x0;
    }
    else {
      p_Var3 = *(_Base_ptr *)
                ((long)&(pQVar1->m)._M_t._M_impl.super__Rb_tree_header._M_header + 0x10);
    }
    p_Var4 = &(pQVar1->m)._M_t._M_impl.super__Rb_tree_header._M_header;
    if (pQVar1 == (QMapData<std::map<int,_QVariant,_std::less<int>,_std::allocator<std::pair<const_int,_QVariant>_>_>_>
                   *)0x0) {
      p_Var4 = (_Rb_tree_node_base *)0x0;
    }
    for (; p_Var3 != p_Var4; p_Var3 = (_Base_ptr)std::_Rb_tree_increment(p_Var3)) {
      s_00 = QDataStream::operator<<(s,p_Var3[1]._M_color);
      ::operator<<(s_00,(QVariant *)&p_Var3[1]._M_parent);
    }
  }
  return s;
}

Assistant:

QDataStream &writeAssociativeContainer(QDataStream &s, const Container &c)
{
    if (!QDataStream::writeQSizeType(s, c.size()))
        return s;
    auto it = c.constBegin();
    auto end = c.constEnd();
    while (it != end) {
        s << it.key() << it.value();
        ++it;
    }

    return s;
}